

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O0

upb_FileDef *
upb_DefBuilder_AddFileToPool
          (upb_DefBuilder *builder,upb_DefPool *s,google_protobuf_FileDescriptorProto *file_proto,
          upb_StringView name,upb_Status *status)

{
  _Bool _Var1;
  int iVar2;
  google_protobuf_FeatureSet *pgVar3;
  upb_value v;
  upb_Status *status_local;
  google_protobuf_FileDescriptorProto *file_proto_local;
  upb_DefPool *s_local;
  upb_DefBuilder *builder_local;
  upb_StringView name_local;
  
  iVar2 = __sigsetjmp(builder->err,0);
  if (iVar2 != 0) {
    _Var1 = upb_Status_IsOk(status);
    if (_Var1) {
      __assert_fail("!upb_Status_IsOk(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/reflection/def_pool.c"
                    ,0x165,
                    "const upb_FileDef *upb_DefBuilder_AddFileToPool(upb_DefBuilder *const, upb_DefPool *const, const google_protobuf_FileDescriptorProto *const, const upb_StringView, upb_Status *const)"
                   );
    }
    if (builder->file != (upb_FileDef *)0x0) {
      remove_filedef(s,builder->file);
      builder->file = (upb_FileDef *)0x0;
    }
LAB_0048a236:
    if (builder->arena != (upb_Arena *)0x0) {
      upb_Arena_Free(builder->arena);
    }
    if (builder->tmp_arena != (upb_Arena *)0x0) {
      upb_Arena_Free(builder->tmp_arena);
    }
    return builder->file;
  }
  if (((builder->arena != (upb_Arena *)0x0) && (builder->tmp_arena != (upb_Arena *)0x0)) &&
     (_Var1 = upb_strtable_init(&builder->feature_cache,0x10,builder->tmp_arena), _Var1)) {
    pgVar3 = google_protobuf_FeatureSet_new(builder->tmp_arena);
    builder->legacy_features = pgVar3;
    if (pgVar3 != (google_protobuf_FeatureSet *)0x0) {
      _upb_FileDef_Create(builder,file_proto);
      v = upb_value_constptr(builder->file);
      upb_strtable_insert(&s->files,name.data,name.size,v,builder->arena);
      _Var1 = upb_Status_IsOk(status);
      if (!_Var1) {
        __assert_fail("upb_Status_IsOk(status)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/reflection/def_pool.c"
                      ,0x174,
                      "const upb_FileDef *upb_DefBuilder_AddFileToPool(upb_DefBuilder *const, upb_DefPool *const, const google_protobuf_FileDescriptorProto *const, const upb_StringView, upb_Status *const)"
                     );
      }
      upb_Arena_Fuse(s->arena,builder->arena);
      goto LAB_0048a236;
    }
  }
  _upb_DefBuilder_OomErr(builder);
}

Assistant:

static const upb_FileDef* upb_DefBuilder_AddFileToPool(
    upb_DefBuilder* const builder, upb_DefPool* const s,
    const UPB_DESC(FileDescriptorProto) * const file_proto,
    const upb_StringView name, upb_Status* const status) {
  if (UPB_SETJMP(builder->err) != 0) {
    UPB_ASSERT(!upb_Status_IsOk(status));
    if (builder->file) {
      remove_filedef(s, builder->file);
      builder->file = NULL;
    }
  } else if (!builder->arena || !builder->tmp_arena ||
             !upb_strtable_init(&builder->feature_cache, 16,
                                builder->tmp_arena) ||
             !(builder->legacy_features =
                   UPB_DESC(FeatureSet_new)(builder->tmp_arena))) {
    _upb_DefBuilder_OomErr(builder);
  } else {
    _upb_FileDef_Create(builder, file_proto);
    upb_strtable_insert(&s->files, name.data, name.size,
                        upb_value_constptr(builder->file), builder->arena);
    UPB_ASSERT(upb_Status_IsOk(status));
    upb_Arena_Fuse(s->arena, builder->arena);
  }

  if (builder->arena) upb_Arena_Free(builder->arena);
  if (builder->tmp_arena) upb_Arena_Free(builder->tmp_arena);
  return builder->file;
}